

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

void __thiscall
helics::CoreFactory::addAssociatedCoreType(CoreFactory *this,string_view name,CoreType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  string local_40;
  
  sVar2 = name._M_len;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,sVar2,this + sVar2);
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,&local_40,
             (CoreType)name._M_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,sVar2,this + sVar2);
  addExtraTypes(&local_40,(CoreType)name._M_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addAssociatedCoreType(std::string_view name, CoreType type)
{
    searchableCores.addType(std::string{name}, type);
    addExtraTypes(std::string{name}, type);
}